

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

void udp_start_tx(udp_ep *ep)

{
  nni_aio *aio;
  udp_txdesc *puVar1;
  ushort uVar2;
  udp_txdesc *puVar3;
  nni_msg *m;
  size_t sVar4;
  void *pvVar5;
  uint nio;
  undefined1 local_68 [8];
  nni_iov iov [3];
  
  if ((((ep->tx_ring).count != 0) && (ep->started == true)) && (ep->tx_busy == false)) {
    ep->tx_busy = true;
    puVar3 = (ep->tx_ring).descs;
    uVar2 = (ep->tx_ring).tail;
    puVar1 = puVar3 + uVar2;
    if (puVar3[uVar2].submitted == false) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp.c"
                ,0x1a7,"desc->submitted");
    }
    iov[0].iov_buf = (void *)0x14;
    m = puVar1->payload;
    local_68 = (undefined1  [8])puVar1;
    if (m == (nni_msg *)0x0) {
      nio = 1;
    }
    else {
      sVar4 = nni_msg_header_len(m);
      if (sVar4 == 0) {
        nio = 1;
      }
      else {
        iov[0].iov_len = (size_t)nni_msg_header(m);
        iov[1].iov_buf = (void *)nni_msg_header_len(m);
        nio = 2;
      }
      sVar4 = nni_msg_len(m);
      if (sVar4 != 0) {
        pvVar5 = nni_msg_body(m);
        *(void **)((long)iov + ((ulong)(nio << 4) - 8)) = pvVar5;
        sVar4 = nni_msg_len(m);
        *(size_t *)((long)&iov[0].iov_buf + (ulong)(nio << 4)) = sVar4;
        nio = nio + 1;
      }
    }
    aio = &ep->tx_aio;
    nni_aio_set_input(aio,0,&puVar1->sa);
    nni_aio_set_iov(aio,nio,(nni_iov *)local_68);
    nni_aio_set_timeout(aio,10000);
    nni_plat_udp_send(ep->udp,aio);
  }
  return;
}

Assistant:

static void
udp_start_tx(udp_ep *ep)
{
	udp_txring *ring = &ep->tx_ring;
	udp_txdesc *desc;
	nng_msg    *msg;

	if ((!ring->count) || (!ep->started) || ep->tx_busy) {
		return;
	}
	ep->tx_busy = true;

	// NB: This does not advance the tail yet.
	// The tail will be advanced when the operation is complete.
	desc = &ring->descs[ring->tail];
	nni_iov iov[3];
	int     niov = 0;

	NNI_ASSERT(desc->submitted);
	iov[0].iov_buf = &desc->header;
	iov[0].iov_len = sizeof(desc->header);
	niov++;

	if ((msg = desc->payload) != NULL) {
		if (nni_msg_header_len(msg) > 0) {
			iov[niov].iov_buf = nni_msg_header(msg);
			iov[niov].iov_len = nni_msg_header_len(msg);
			niov++;
		}
		if (nni_msg_len(msg) > 0) {
			iov[niov].iov_buf = nni_msg_body(msg);
			iov[niov].iov_len = nni_msg_len(msg);
			niov++;
		}
	}
	nni_aio_set_input(&ep->tx_aio, 0, &desc->sa);
	nni_aio_set_iov(&ep->tx_aio, niov, iov);
	// it should *never* take this long, but allow for ARP resolution
	nni_aio_set_timeout(&ep->tx_aio, NNI_SECOND * 10);
	nni_udp_send(ep->udp, &ep->tx_aio);
}